

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O2

Vec4 deqp::gles3::Functional::readVec4(float *ptr,int numComponents)

{
  float fVar1;
  float *in_RDI;
  ulong uVar2;
  float fVar3;
  float fVar4;
  Vec4 VVar5;
  
  fVar1 = *ptr;
  uVar2 = 0;
  if (numComponents < 2) {
    fVar4 = 0.0;
    fVar3 = 0.0;
  }
  else {
    fVar3 = ptr[1];
    if (numComponents == 2) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = ptr[2];
      if (3 < (uint)numComponents) {
        uVar2 = (ulong)(uint)ptr[3];
      }
    }
  }
  *in_RDI = fVar1;
  in_RDI[1] = fVar3;
  in_RDI[2] = fVar4;
  in_RDI[3] = (float)uVar2;
  VVar5.m_data[2] = fVar1;
  VVar5.m_data[0] = (float)(int)uVar2;
  VVar5.m_data[1] = (float)(int)(uVar2 >> 0x20);
  VVar5.m_data[3] = 0.0;
  return (Vec4)VVar5.m_data;
}

Assistant:

static inline Vec4 readVec4 (const float* ptr, int numComponents)
{
	DE_ASSERT(numComponents >= 1);
	return Vec4(ptr[0],
				numComponents >= 2 ? ptr[1] : 0.0f,
				numComponents >= 3 ? ptr[2] : 0.0f,
				numComponents >= 4 ? ptr[3] : 0.0f);
}